

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_dynlink_path_test.cpp
# Opt level: O3

void __thiscall
metacall_dynlink_path_test_DefaultConstructor_Test::
~metacall_dynlink_path_test_DefaultConstructor_Test
          (metacall_dynlink_path_test_DefaultConstructor_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(metacall_dynlink_path_test, DefaultConstructor)
{
	metacall_print_info();

	dynlink_library_path_str path;

	const char name[] = "metacall"
#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
						"d"
#endif
		;

	size_t length = 0;

	printf(METACALL_LIBRARY_PATH "\n");
	fflush(stdout);

	ASSERT_EQ((int)0, (int)dynlink_library_path(name, path, &length));

	printf("%s == %s\n", path, METACALL_LIBRARY_PATH);
	fflush(stdout);

	ASSERT_EQ((int)0, (int)portability_path_compare(path, METACALL_LIBRARY_PATH));
}